

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandCec(Abc_Frame_t *pAbc,int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  uint nInsLimit;
  uint nConfLimit;
  uint uVar3;
  int iVar4;
  Abc_Ntk_t *pNtk;
  char *pcVar5;
  char *pcVar6;
  uint local_74;
  uint local_70;
  uint local_6c;
  Abc_Ntk_t *pNtk2;
  uint local_5c;
  uint local_58;
  uint local_54;
  int fDelete2;
  int fDelete1;
  char Buffer [16];
  
  pNtk = Abc_FrameReadNtk(pAbc);
  local_5c = 0;
  Extra_UtilGetoptReset();
  nConfLimit = 10000;
  local_74 = 0x14;
  local_70 = 0;
  local_6c = 0;
  nInsLimit = 0;
  local_54 = 0;
  local_58 = 0;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"TCIPpsnvh"), iVar4 = globalUtilOptind, 0x4f < iVar2)
    {
      switch(iVar2) {
      case 0x6e:
        local_58 = local_58 ^ 1;
        break;
      case 0x6f:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x75:
        goto switchD_0026c851_caseD_6f;
      case 0x70:
        local_54 = local_54 ^ 1;
        break;
      case 0x73:
        local_5c = local_5c ^ 1;
        break;
      case 0x76:
        local_70 = local_70 ^ 1;
        break;
      default:
        if (iVar2 != 0x50) {
          if (iVar2 == 0x54) {
            if (globalUtilOptind < argc) {
              local_74 = atoi(argv[globalUtilOptind]);
              uVar3 = local_74;
              goto joined_r0x0026c8b9;
            }
            pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
            goto LAB_0026ca40;
          }
          goto switchD_0026c851_caseD_6f;
        }
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
LAB_0026ca40:
          Abc_Print(-1,pcVar5);
          goto switchD_0026c851_caseD_6f;
        }
        local_6c = atoi(argv[globalUtilOptind]);
        globalUtilOptind = iVar4 + 1;
        if ((int)local_6c < 0) {
LAB_0026ca53:
          sprintf(Buffer,"%d",(ulong)local_6c);
LAB_0026ca7c:
          Abc_Print(-2,"usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n");
          Abc_Print(-2,"\t         performs combinational equivalence checking\n");
          Abc_Print(-2,"\t-T num : approximate runtime limit in seconds [default = %d]\n",
                    (ulong)local_74);
          Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",
                    (ulong)nConfLimit);
          Abc_Print(-2,"\t-I num : limit on the number of clause inspections [default = %d]\n",
                    (ulong)nInsLimit);
          Abc_Print(-2,"\t-P num : partition size for multi-output networks [default = %s]\n",Buffer
                   );
          pcVar6 = "yes";
          pcVar5 = "yes";
          if (local_54 == 0) {
            pcVar5 = "no";
          }
          Abc_Print(-2,"\t-p     : toggle automatic partitioning [default = %s]\n",pcVar5);
          pcVar5 = "SAT only";
          if (local_5c == 0) {
            pcVar5 = "FRAIG + SAT";
          }
          Abc_Print(-2,"\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n",pcVar5)
          ;
          pcVar5 = "by order";
          if (local_58 == 0) {
            pcVar5 = "by name";
          }
          Abc_Print(-2,
                    "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n"
                    ,pcVar5);
          if (local_70 == 0) {
            pcVar6 = "no";
          }
          Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
          Abc_Print(-2,"\t-h     : print the command usage\n");
          Abc_Print(-2,"\tfile1  : (optional) the file with the first network\n");
          Abc_Print(-2,"\tfile2  : (optional) the file with the second network\n");
          Abc_Print(-2,"\t         if no files are given, uses the current network and its spec\n");
          pcVar5 = "\t         if one file is given, uses the current network and the file\n";
          iVar4 = -2;
LAB_0026cbf5:
          Abc_Print(iVar4,pcVar5);
          return 1;
        }
      }
    }
    if (iVar2 == 0x43) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0026ca40;
      }
      nConfLimit = atoi(argv[globalUtilOptind]);
      uVar3 = nConfLimit;
    }
    else {
      if (iVar2 != 0x49) {
        if (iVar2 != -1) break;
        if ((pNtk == (Abc_Ntk_t *)0x0) || (pNtk->vPhases == (Vec_Int_t *)0x0)) {
          iVar4 = Abc_NtkPrepareTwoNtks
                            (_stdout,pNtk,argv + globalUtilOptind,argc - globalUtilOptind,
                             (Abc_Ntk_t **)Buffer,&pNtk2,&fDelete1,&fDelete2,1);
          if (iVar4 == 0) {
            return 1;
          }
          if (local_58 != 0) {
            if (fDelete1 == 0) {
              Buffer._0_8_ = Abc_NtkStrash((Abc_Ntk_t *)Buffer._0_8_,0,1,0);
              fDelete1 = 1;
            }
            if (fDelete2 == 0) {
              pNtk2 = Abc_NtkStrash(pNtk2,0,1,0);
              fDelete2 = 1;
            }
            Abc_NtkShortNames((Abc_Ntk_t *)Buffer._0_8_);
            Abc_NtkShortNames(pNtk2);
          }
          if (local_54 == 0) {
            if (local_6c == 0) {
              if (local_5c == 0) {
                Abc_NtkCecFraig((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_74,local_70);
              }
              else {
                Abc_NtkCecSat((Abc_Ntk_t *)Buffer._0_8_,pNtk2,nConfLimit,nInsLimit);
              }
            }
            else {
              Abc_NtkCecFraigPart((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_74,local_6c,local_70);
            }
          }
          else {
            Abc_NtkCecFraigPartAuto((Abc_Ntk_t *)Buffer._0_8_,pNtk2,local_74,local_70);
          }
          if (fDelete1 != 0) {
            Abc_NtkDelete((Abc_Ntk_t *)Buffer._0_8_);
          }
          if (fDelete2 != 0) {
            Abc_NtkDelete(pNtk2);
            return 0;
          }
          return 0;
        }
        pcVar5 = "Cannot compare networks with phases defined.\n";
        iVar4 = -1;
        goto LAB_0026cbf5;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0026ca40;
      }
      nInsLimit = atoi(argv[globalUtilOptind]);
      uVar3 = nInsLimit;
    }
joined_r0x0026c8b9:
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)uVar3);
switchD_0026c851_caseD_6f:
  if (local_6c == 0) {
    builtin_strncpy(Buffer,"unused",7);
    uVar1 = Buffer._0_4_;
    Buffer._0_8_ = CONCAT44(Buffer._4_4_,uVar1);
    goto LAB_0026ca7c;
  }
  goto LAB_0026ca53;
}

Assistant:

int Abc_CommandCec( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    char Buffer[16];
    Abc_Ntk_t * pNtk, * pNtk1, * pNtk2;
    int fDelete1, fDelete2;
    char ** pArgvNew;
    int nArgcNew;
    int c;
    int fSat;
    int fVerbose;
    int nSeconds;
    int nPartSize;
    int nConfLimit;
    int nInsLimit;
    int fPartition;
    int fIgnoreNames;

    extern void Abc_NtkCecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit );
    extern void Abc_NtkCecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );
    extern void Abc_NtkCecFraigPart( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nPartSize, int fVerbose );
    extern void Abc_NtkCecFraigPartAuto( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    fSat     =  0;
    fVerbose =  0;
    nSeconds = 20;
    nPartSize  = 0;
    nConfLimit = 10000;
    nInsLimit  = 0;
    fPartition = 0;
    fIgnoreNames = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TCIPpsnvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nSeconds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nSeconds < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPartSize < 0 )
                goto usage;
            break;
        case 'p':
            fPartition ^= 1;
            break;
        case 's':
            fSat ^= 1;
            break;
        case 'n':
            fIgnoreNames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk && pNtk->vPhases != NULL )
    {
        Abc_Print( -1, "Cannot compare networks with phases defined.\n" );
        return 1;
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( !Abc_NtkPrepareTwoNtks( stdout, pNtk, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2, 1 ) )
        return 1;

    if ( fIgnoreNames )
    {
        if ( !fDelete1 )
        {
            pNtk1 = Abc_NtkStrash( pNtk1, 0, 1, 0 );
            fDelete1 = 1;
        }
        if ( !fDelete2 )
        {
            pNtk2 = Abc_NtkStrash( pNtk2, 0, 1, 0 );
            fDelete2 = 1;
        }
        Abc_NtkShortNames( pNtk1 );
        Abc_NtkShortNames( pNtk2 );
    }

    // perform equivalence checking
    if ( fPartition )
        Abc_NtkCecFraigPartAuto( pNtk1, pNtk2, nSeconds, fVerbose );
    else if ( nPartSize )
        Abc_NtkCecFraigPart( pNtk1, pNtk2, nSeconds, nPartSize, fVerbose );
    else if ( fSat )
        Abc_NtkCecSat( pNtk1, pNtk2, nConfLimit, nInsLimit );
    else
        Abc_NtkCecFraig( pNtk1, pNtk2, nSeconds, fVerbose );

    if ( fDelete1 ) Abc_NtkDelete( pNtk1 );
    if ( fDelete2 ) Abc_NtkDelete( pNtk2 );
    return 0;

usage:
    if ( nPartSize == 0 )
        strcpy( Buffer, "unused" );
    else
        sprintf(Buffer, "%d", nPartSize );
    Abc_Print( -2, "usage: cec [-T num] [-C num] [-I num] [-P num] [-psnvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t         performs combinational equivalence checking\n" );
    Abc_Print( -2, "\t-T num : approximate runtime limit in seconds [default = %d]\n", nSeconds );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of clause inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-P num : partition size for multi-output networks [default = %s]\n", Buffer );
    Abc_Print( -2, "\t-p     : toggle automatic partitioning [default = %s]\n", fPartition? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle \"SAT only\" and \"FRAIG + SAT\" [default = %s]\n", fSat? "SAT only": "FRAIG + SAT" );
    Abc_Print( -2, "\t-n     : toggle how CIs/COs are matched (by name or by order) [default = %s]\n", fIgnoreNames? "by order": "by name" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\tfile1  : (optional) the file with the first network\n");
    Abc_Print( -2, "\tfile2  : (optional) the file with the second network\n");
    Abc_Print( -2, "\t         if no files are given, uses the current network and its spec\n");
    Abc_Print( -2, "\t         if one file is given, uses the current network and the file\n");
    return 1;
}